

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

void amrex::parser_ast_print(parser_node *node,string *space,AllPrint *printer)

{
  Print *this;
  string *in_RDX;
  parser_node *in_RSI;
  undefined4 *in_RDI;
  string *more_space;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  Print *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdd8;
  int __val;
  AllPrint *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  parser_f3 *in_stack_ffffffffffffff80;
  string local_70 [16];
  AllPrint *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  parser_f2 *in_stack_ffffffffffffffb0;
  AllPrint *printer_00;
  
  __val = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  printer_00 = (AllPrint *)&stack0xffffffffffffffc0;
  std::operator+(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  switch(*in_RDI) {
  case 1:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [9])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(double *)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 2:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [11])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 3:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [5])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 4:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [5])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 5:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [5])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 6:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [5])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 7:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [5])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 8:
    parser_ast_print_f1((parser_f1 *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff70);
    break;
  case 9:
    parser_ast_print_f2(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0);
    break;
  case 10:
    parser_ast_print_f3(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff70);
    break;
  case 0xb:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [4])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [4])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 0xc:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    parser_ast_print(in_RSI,in_RDX,printer_00);
    break;
  case 0xd:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(double *)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0xe:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [3])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0xf:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(double *)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x10:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [3])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x11:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(double *)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x12:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [3])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x13:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(double *)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x14:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [3])in_stack_fffffffffffffd88);
    this = Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(this,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  case 0x15:
    Print::operator<<(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [6])in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char **)in_stack_fffffffffffffd88);
    Print::operator<<(in_stack_fffffffffffffd90,(char (*) [2])in_stack_fffffffffffffd88);
    break;
  default:
    std::__cxx11::to_string(__val);
    std::operator+(in_stack_fffffffffffffd98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd90);
    Abort(in_stack_fffffffffffffd88);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void
parser_ast_print (struct parser_node* node, std::string const& space, AllPrint& printer)
{
    std::string const& more_space = space + "  ";
    switch (node->type)
    {
    case PARSER_NUMBER:
        printer << space << "NUMBER: " << ((struct parser_number*)node)->value << "\n";
        break;
    case PARSER_SYMBOL:
        printer << space << "VARIABLE: " << ((struct parser_symbol*)node)->name << "\n";
        break;
    case PARSER_ADD:
        printer << space << "ADD\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_SUB:
        printer << space << "SUB\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_MUL:
        printer << space << "MUL\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_DIV:
        printer << space << "DIV\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_NEG:
        printer << space << "NEG\n";
        parser_ast_print(node->l, more_space, printer);
        break;
    case PARSER_F1:
        parser_ast_print_f1((struct parser_f1*)node, space, printer);
        break;
    case PARSER_F2:
        parser_ast_print_f2((struct parser_f2*)node, space, printer);
        break;
    case PARSER_F3:
        parser_ast_print_f3((struct parser_f3*)node, space, printer);
        break;
    case PARSER_ASSIGN:
        printer << space << "=: " << ((struct parser_assign*)node)->s->name << " =\n";
        parser_ast_print(((struct parser_assign*)node)->v, more_space, printer);
        break;
    case PARSER_LIST:
        printer << space <<"LIST\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_ADD_VP:
        printer << space << "ADD: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_VP:
        printer << space << "SUB: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_VP:
        printer << space << "MUL: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_VP:
        printer << space << "DIV: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_NEG_P:
        printer << space << "NEG: " << ((struct parser_symbol*)(node->l))->name << "\n";
        break;
    case PARSER_ADD_PP:
        printer << space << "ADD: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_PP:
        printer << space << "SUB: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_PP:
        printer << space << "MUL: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_PP:
        printer << space << "DIV: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
    }
}